

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O1

void set_gamma(GLFWwindow *window,float value)

{
  GLFWmonitor *handle;
  
  handle = glfwGetWindowMonitor(window);
  if (handle == (GLFWmonitor *)0x0) {
    handle = glfwGetPrimaryMonitor();
  }
  gamma_value = value;
  printf("Gamma: %f\n",(double)value);
  glfwSetGamma(handle,gamma_value);
  return;
}

Assistant:

static void set_gamma(GLFWwindow* window, float value)
{
    GLFWmonitor* monitor = glfwGetWindowMonitor(window);
    if (!monitor)
        monitor = glfwGetPrimaryMonitor();

    gamma_value = value;
    printf("Gamma: %f\n", gamma_value);
    glfwSetGamma(monitor, gamma_value);
}